

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.cpp
# Opt level: O2

void __thiscall CompilationContext::suppressWaring(CompilationContext *this,char *text_id)

{
  long lVar1;
  int iVar2;
  long lVar3;
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  lVar1 = 8;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x18 == 0x878) {
      std::__cxx11::string::string
                ((string *)&local_40,"Cannot suppress warning, text id not found: ",&local_61);
      std::operator+(&local_60,&local_40,text_id);
      error(this,0x1e,local_60._M_dataplus._M_p,0,0);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
      return;
    }
    iVar2 = strcmp(text_id,*(char **)((long)&analyzer_messages[0].intId + lVar3));
    lVar1 = lVar3 + 0x18;
  } while (iVar2 != 0);
  suppressWaring(this,*(int *)((long)&__dso_handle + lVar3));
  return;
}

Assistant:

void CompilationContext::suppressWaring(const char * text_id)
{
  for (int i = 0; i < sizeof(analyzer_messages) / sizeof(analyzer_messages[0]); i++)
    if (!strcmp(text_id, analyzer_messages[i].textId))
    {
      suppressWaring(analyzer_messages[i].intId);
      return;
    }

  error(30, (string("Cannot suppress warning, text id not found: ") + text_id).c_str(), 0, 0);
}